

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_cmac_process(aes_context *ctx,uint8_t *block,uint8_t *buffer,uint32_t size)

{
  int iVar1;
  ulong local_30;
  size_t k;
  uint32_t i;
  uint32_t size_local;
  uint8_t *buffer_local;
  uint8_t *block_local;
  aes_context *ctx_local;
  
  if ((size & 0xf) == 0) {
    iVar1 = aes_supported_x86();
    if (iVar1 == 0) {
      _i = buffer;
      for (k._0_4_ = 0; (uint)k < size; k._0_4_ = (uint)k + 0x10) {
        for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
          block[local_30] = block[local_30] ^ *_i;
          _i = _i + 1;
        }
        aes_ecb_encrypt(ctx,block,block);
      }
    }
    else {
      aes_cmac_process_x86(ctx,block,buffer,size);
    }
    return;
  }
  __assert_fail("size % 16 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/soarqin[P]psvimgtools/aes.c",
                0x213,
                "void aes_cmac_process(const aes_context *, uint8_t *, const uint8_t *, uint32_t)");
}

Assistant:

static void aes_cmac_process(const aes_context* ctx, uint8_t* block, const uint8_t *buffer, uint32_t size)
{
    assert(size % 16 == 0);

#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_cmac_process_x86(ctx, block, buffer, size);
        return;
    }
#endif
    for (uint32_t i = 0; i < size; i += 16)
    {
        for (size_t k = 0; k < 16; k++)
        {
            block[k] ^= *buffer++;
        }
        aes_ecb_encrypt(ctx, block, block);
    }
}